

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyFreeStyles(TidyDocImpl *doc)

{
  TagStyle *pTVar1;
  TagStyle *next;
  TagStyle *style;
  Lexer *lexer;
  TidyDocImpl *doc_local;
  
  if (doc->lexer != (Lexer *)0x0) {
    next = doc->lexer->styles;
    while (next != (TagStyle *)0x0) {
      pTVar1 = next->next;
      (*doc->allocator->vtbl->free)(doc->allocator,next->tag);
      (*doc->allocator->vtbl->free)(doc->allocator,next->tag_class);
      (*doc->allocator->vtbl->free)(doc->allocator,next->properties);
      (*doc->allocator->vtbl->free)(doc->allocator,next);
      next = pTVar1;
    }
  }
  return;
}

Assistant:

void TY_(FreeStyles)( TidyDocImpl* doc )
{
    Lexer* lexer = doc->lexer;
    if ( lexer )
    {
        TagStyle *style, *next;
        for ( style = lexer->styles; style; style = next )
        {
            next = style->next;
            TidyDocFree( doc, style->tag );
            TidyDocFree( doc, style->tag_class );
            TidyDocFree( doc, style->properties );
            TidyDocFree( doc, style );
        }
    }
}